

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O0

int QtMWidgets::FingerGeometry::touchBounce(void)

{
  int iVar1;
  int *piVar2;
  int local_20 [5];
  int local_c;
  
  if (touchBounce()::bounce == '\0') {
    iVar1 = __cxa_guard_acquire(&touchBounce()::bounce);
    if (iVar1 != 0) {
      local_c = height();
      local_20[0] = width();
      piVar2 = qMax<int>(&local_c,local_20);
      touchBounce::bounce = qRound((double)*piVar2 * 0.2);
      __cxa_guard_release(&touchBounce()::bounce);
    }
  }
  return touchBounce::bounce;
}

Assistant:

int
FingerGeometry::touchBounce()
{
	static const int bounce = qRound(
		(qreal) qMax( FingerGeometry::height(), FingerGeometry::width() ) * 0.2 );

	return bounce;
}